

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

String * __thiscall
capnp::compiler::CompilerMain::readOneText
          (String *__return_storage_ptr__,CompilerMain *this,BufferedInputStreamWrapper *input)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  RemoveConst<char> *pRVar4;
  int iVar5;
  undefined4 extraout_var;
  char *pcVar6;
  size_t __n;
  size_t __n_00;
  size_t sVar7;
  char *pcVar8;
  bool bVar9;
  Vector<char> chars;
  Vector<char> local_68;
  uint local_48;
  int local_44;
  String *local_40;
  BufferedInputStreamWrapper *local_38;
  void *__src;
  
  local_68.builder.ptr = (char *)0x0;
  local_68.builder.pos = (char *)0x0;
  local_68.builder.endPtr = (char *)0x0;
  local_68.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  local_48 = 0;
  local_44 = 0;
  bVar2 = false;
  local_40 = __return_storage_ptr__;
  local_38 = input;
  do {
    iVar5 = (*(input->super_BufferedInputStream).super_InputStream._vptr_InputStream[4])(input);
    __src = (void *)CONCAT44(extraout_var,iVar5);
    if (__n == 0) {
      if (local_68.builder.pos == local_68.builder.endPtr) {
        sVar7 = ((long)local_68.builder.endPtr - (long)local_68.builder.ptr) * 2;
        if (local_68.builder.endPtr == local_68.builder.ptr) {
          sVar7 = 4;
        }
        kj::Vector<char>::setCapacity(&local_68,sVar7);
      }
      *local_68.builder.pos = '\0';
      local_68.builder.pos = local_68.builder.pos + 1;
      if (local_68.builder.pos != local_68.builder.endPtr) {
        kj::Vector<char>::setCapacity
                  (&local_68,(long)local_68.builder.pos - (long)local_68.builder.ptr);
      }
      pcVar6 = local_68.builder.ptr;
      sVar7 = (long)local_68.builder.pos - (long)local_68.builder.ptr;
      local_68.builder.ptr = (char *)0x0;
      local_68.builder.pos = (char *)0x0;
      local_68.builder.endPtr = (char *)0x0;
      (local_40->content).ptr = pcVar6;
      (local_40->content).size_ = sVar7;
      (local_40->content).disposer = local_68.builder.disposer;
LAB_00121f05:
      bVar9 = false;
    }
    else {
      bVar9 = false;
      __n_00 = 0;
      iVar5 = local_44;
      do {
        cVar1 = *(char *)((long)__src + __n_00);
        if (bVar2) {
          bVar3 = true;
          bVar2 = cVar1 != '\n';
        }
        else {
          bVar3 = true;
          bVar2 = false;
          if (cVar1 == ')') {
            if (iVar5 == 0) {
              iVar5 = 0;
            }
            else {
              iVar5 = iVar5 + -1;
              local_48 = local_48 & 0xff;
              if (iVar5 == 0) {
                local_48 = 1;
              }
            }
          }
          else {
            bVar2 = false;
            if (cVar1 == '(') {
              if ((iVar5 == 0) && ((local_48 & 1) != 0)) {
                pcVar6 = local_68.builder.pos + (__n_00 - (long)local_68.builder.ptr);
                if (local_68.builder.endPtr + -(long)local_68.builder.ptr < pcVar6) {
                  pcVar8 = (char *)((long)(local_68.builder.endPtr + -(long)local_68.builder.ptr) *
                                   2);
                  if (local_68.builder.endPtr == local_68.builder.ptr) {
                    pcVar8 = (char *)0x4;
                  }
                  if (pcVar8 < pcVar6) {
                    pcVar8 = pcVar6;
                  }
                  kj::Vector<char>::setCapacity(&local_68,(size_t)pcVar8);
                }
                pRVar4 = local_68.builder.pos;
                if (__n_00 != 0) {
                  memcpy(local_68.builder.pos,__src,__n_00);
                }
                local_68.builder.pos = pRVar4 + __n_00;
                if (local_68.builder.pos == local_68.builder.endPtr) {
                  sVar7 = ((long)local_68.builder.endPtr - (long)local_68.builder.ptr) * 2;
                  if (local_68.builder.endPtr == local_68.builder.ptr) {
                    sVar7 = 4;
                  }
                  kj::Vector<char>::setCapacity(&local_68,sVar7);
                }
                input = local_38;
                *local_68.builder.pos = '\0';
                local_68.builder.pos = local_68.builder.pos + 1;
                (*(local_38->super_BufferedInputStream).super_InputStream._vptr_InputStream[3])
                          (local_38,__n_00);
                if (local_68.builder.pos != local_68.builder.endPtr) {
                  kj::Vector<char>::setCapacity
                            (&local_68,(long)local_68.builder.pos - (long)local_68.builder.ptr);
                }
                pcVar6 = local_68.builder.ptr;
                sVar7 = (long)local_68.builder.pos - (long)local_68.builder.ptr;
                local_68.builder.ptr = (char *)0x0;
                local_68.builder.pos = (char *)0x0;
                local_68.builder.endPtr = (char *)0x0;
                (local_40->content).ptr = pcVar6;
                (local_40->content).size_ = sVar7;
                (local_40->content).disposer = local_68.builder.disposer;
                bVar3 = false;
                iVar5 = 0;
                bVar2 = false;
              }
              else {
                iVar5 = iVar5 + 1;
              }
            }
            else if (cVar1 == '#') {
              bVar2 = true;
            }
          }
        }
        if (!bVar3) break;
        __n_00 = __n_00 + 1;
        bVar9 = __n == __n_00;
      } while (!bVar9);
      local_44 = iVar5;
      if (!bVar9) goto LAB_00121f05;
      pcVar6 = local_68.builder.pos + (__n - (long)local_68.builder.ptr);
      if (local_68.builder.endPtr + -(long)local_68.builder.ptr < pcVar6) {
        pcVar8 = (char *)((long)(local_68.builder.endPtr + -(long)local_68.builder.ptr) * 2);
        if (local_68.builder.endPtr == local_68.builder.ptr) {
          pcVar8 = (char *)0x4;
        }
        if (pcVar8 < pcVar6) {
          pcVar8 = pcVar6;
        }
        kj::Vector<char>::setCapacity(&local_68,(size_t)pcVar8);
      }
      pRVar4 = local_68.builder.pos;
      memcpy(local_68.builder.pos,__src,__n);
      input = local_38;
      local_68.builder.pos = pRVar4 + __n;
      bVar9 = true;
      (*(local_38->super_BufferedInputStream).super_InputStream._vptr_InputStream[3])(local_38,__n);
    }
    pcVar8 = local_68.builder.endPtr;
    pRVar4 = local_68.builder.pos;
    pcVar6 = local_68.builder.ptr;
    if (!bVar9) {
      if (local_68.builder.ptr != (char *)0x0) {
        local_68.builder.ptr = (char *)0x0;
        local_68.builder.pos = (RemoveConst<char> *)0x0;
        local_68.builder.endPtr = (char *)0x0;
        (**(local_68.builder.disposer)->_vptr_ArrayDisposer)
                  (local_68.builder.disposer,pcVar6,1,(long)pRVar4 - (long)pcVar6,
                   (long)pcVar8 - (long)pcVar6,0);
      }
      return local_40;
    }
  } while( true );
}

Assistant:

kj::String readOneText(kj::BufferedInputStreamWrapper& input) {
    // Consume and return one parentheses-delimited message from the input.
    //
    // Accounts for nested parentheses, comments, and string literals.

    enum {
      NORMAL,
      COMMENT,
      QUOTE,
      QUOTE_ESCAPE,
      DQUOTE,
      DQUOTE_ESCAPE
    } state = NORMAL;
    uint depth = 0;
    bool sawClose = false;

    kj::Vector<char> chars;

    for (;;) {
      auto buffer = input.tryGetReadBuffer();

      if (buffer == nullptr) {
        // EOF
        chars.add('\0');
        return kj::String(chars.releaseAsArray());
      }

      for (auto i: kj::indices(buffer)) {
        char c = buffer[i];
        switch (state) {
          case NORMAL:
            switch (c) {
              case '#': state = COMMENT; break;
              case '(':
                if (depth == 0 && sawClose) {
                  // We already got one complete message. This is the start of the next message.
                  // Stop here.
                  chars.addAll(buffer.first(i));
                  chars.add('\0');
                  input.skip(i);
                  return kj::String(chars.releaseAsArray());
                }
                ++depth;
                break;
              case ')':
                if (depth > 0) {
                  if (--depth == 0) {
                    sawClose = true;
                  }
                }
                break;
              default: break;
            }
            break;
          case COMMENT:
            switch (c) {
              case '\n': state = NORMAL; break;
              default: break;
            }
            break;
          case QUOTE:
            switch (c) {
              case '\'': state = NORMAL; break;
              case '\\': state = QUOTE_ESCAPE; break;
              default: break;
            }
            break;
          case QUOTE_ESCAPE:
            break;
          case DQUOTE:
            switch (c) {
              case '\"': state = NORMAL; break;
              case '\\': state = DQUOTE_ESCAPE; break;
              default: break;
            }
            break;
          case DQUOTE_ESCAPE:
            break;
        }
      }

      chars.addAll(buffer);
      input.skip(buffer.size());
    }
  }